

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbengine.cpp
# Opt level: O1

void __thiscall banksia::WbEngine::tickWork(WbEngine *this)

{
  int iVar1;
  size_t in_RCX;
  void *__buf;
  PlayerState st;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  Engine::tickWork((Engine *)this);
  if ((this->super_EngineProfile).super_Engine.super_Player.state == starting) {
    if (this->tick_delay_2_ready < 1) {
      if ((this->super_EngineProfile).super_Engine.super_Player.tick_state < 0x15) {
        return;
      }
      st = stopped;
      if (1 < (this->super_EngineProfile).super_Engine.correctCmdCnt) {
        return;
      }
    }
    else {
      iVar1 = this->tick_delay_2_ready + -1;
      this->tick_delay_2_ready = iVar1;
      if (iVar1 != 0) {
        return;
      }
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"force","");
      Engine::write((Engine *)this,(int)(string *)local_40,__buf,in_RCX);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0]);
      }
      st = ready;
      if (this->feature_ping == true) {
        (*(this->super_EngineProfile).super_Engine.super_Player.super_Obj._vptr_Obj[0x1f])(this);
      }
    }
    Player::setState((Player *)this,st);
  }
  return;
}

Assistant:

void WbEngine::tickWork()
{
    EngineProfile::tickWork();

    if (getState() == PlayerState::starting) {
        if (tick_delay_2_ready > 0) {
            tick_delay_2_ready--;
            if (tick_delay_2_ready == 0) {
                write("force");
                if (feature_ping) {
                    sendPing();
                }
                setState(PlayerState::ready);
            }
        } else if (tick_state > 10 * 2 && correctCmdCnt < 2) {
            // crashed
            setState(PlayerState::stopped);
        }
    }
}